

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

double * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::at
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
           *this,key_type *key)

{
  bool bVar1;
  LogMessage *other;
  const_pointer pvVar2;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  const_iterator local_48;
  undefined1 local_30 [8];
  const_iterator it;
  key_type *key_local;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this_local;
  
  it.it_.bucket_index_ = (size_type)key;
  find((const_iterator *)local_30,this,key);
  end(&local_48,this);
  bVar1 = protobuf::operator!=((const_iterator *)local_30,&local_48);
  local_81 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x418);
    local_81 = 1;
    other = internal::LogMessage::operator<<(&local_80,"CHECK failed: it != end(): ");
    internal::LogFinisher::operator=(local_95,other);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  pvVar2 = const_iterator::operator->((const_iterator *)local_30);
  return &pvVar2->second;
}

Assistant:

const T& at(const key_type& key) const {
    const_iterator it = find(key);
    GOOGLE_CHECK(it != end());
    return it->second;
  }